

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yl_opt.c
# Opt level: O3

int yl_opt_update_out_format(char *arg,yl_opt *yo)

{
  int iVar1;
  int iVar2;
  
  iVar1 = yl_opt_update_schema_out_format(arg,yo);
  iVar2 = 0;
  if (iVar1 != 0) {
    iVar1 = yl_opt_update_data_out_format(arg,yo);
    iVar2 = 0;
    if (iVar1 != 0) {
      iVar1 = strcasecmp(arg,"feature-param");
      if (iVar1 == 0) {
        yo->feature_param_format = '\x01';
      }
      else {
        yl_log('\x01',"Unknown output format %s.",arg);
        iVar2 = 1;
      }
    }
  }
  return iVar2;
}

Assistant:

int
yl_opt_update_out_format(const char *arg, struct yl_opt *yo)
{
    if (!yl_opt_update_schema_out_format(arg, yo)) {
        return 0;
    }
    if (!yl_opt_update_data_out_format(arg, yo)) {
        return 0;
    }
    if (!yl_opt_update_other_out_format(arg, yo)) {
        return 0;
    }

    YLMSG_E("Unknown output format %s.", arg);
    return 1;
}